

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int Init12Video(void)

{
  ushort uVar1;
  SDL20_AllocFormat_t p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  VideoModeList *pVVar10;
  SDL12_Rect **ppSVar11;
  int iVar12;
  long lVar13;
  Uint16 maxw;
  SDL_bool SVar14;
  int iVar15;
  Uint32 UVar16;
  SDL_bool SVar17;
  VideoModeList *pVVar18;
  ushort uVar19;
  uint uVar20;
  undefined4 uVar21;
  uint h;
  SDL_DisplayMode mode;
  SDL12_Rect current_mode;
  int local_90;
  SDL_DisplayMode local_80;
  SDL12_Rect local_68;
  SDL_bool local_5c;
  char *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  pcVar5 = (*SDL20_GetCurrentVideoDriver)();
  pcVar6 = (*SDL20_getenv)("SDL12COMPAT_SCALE_METHOD");
  pcVar7 = (*SDL20_getenv)("SDL12COMPAT_MAX_BPP");
  if (pcVar7 == (char *)0x0) {
    lVar8 = 0x20;
  }
  else {
    lVar8 = (*SDL20_strtol)(pcVar7,(char **)0x0,10);
  }
  pcVar7 = (*SDL20_getenv)("SDL12COMPAT_ALLOW_THREADED_DRAWS");
  SVar17 = SDL_TRUE;
  SVar14 = SDL_TRUE;
  if (pcVar7 != (char *)0x0) {
    lVar9 = (*SDL20_strtol)(pcVar7,(char **)0x0,10);
    SVar14 = (SDL_bool)((int)lVar9 != 0);
  }
  AllowThreadedDraws = SVar14;
  pcVar7 = (*SDL20_getenv)("SDL12COMPAT_ALLOW_THREADED_PUMPS");
  if (pcVar7 != (char *)0x0) {
    lVar9 = (*SDL20_strtol)(pcVar7,(char **)0x0,10);
    SVar17 = (SDL_bool)((int)lVar9 != 0);
  }
  AllowThreadedPumps = SVar17;
  if (pcVar6 == (char *)0x0) {
    WantScaleMethodNearest = SDL_FALSE;
  }
  else {
    iVar3 = (*SDL20_strcmp)(pcVar6,"nearest");
    WantScaleMethodNearest = (SDL_bool)(iVar3 == 0);
  }
  SVar14 = TranslateKeyboardLayout;
  pcVar6 = (*SDL20_getenv)("SDL12COMPAT_USE_KEYBOARD_LAYOUT");
  if (pcVar6 != (char *)0x0) {
    lVar9 = (*SDL20_strtol)(pcVar6,(char **)0x0,10);
    SVar14 = (SDL_bool)((int)lVar9 != 0);
  }
  TranslateKeyboardLayout = SVar14;
  if (pcVar5 == (char *)0x0) {
    IsDummyVideo = SDL_FALSE;
  }
  else {
    iVar3 = (*SDL20_strcmp)(pcVar5,"dummy");
    IsDummyVideo = (SDL_bool)(iVar3 == 0);
  }
  EventQueueMutex = (*SDL20_CreateMutex)();
  iVar3 = -1;
  if (EventQueueMutex != (SDL_mutex *)0x0) {
    lVar9 = 0x12a158;
    lVar13 = 0x7f;
    do {
      *(long *)(lVar9 + -8) = lVar9;
      lVar9 = lVar9 + 0xe8;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    EventQueuePool[0x7f].next = (EventQueueType *)0x0;
    EventQueueTail = (EventQueueType *)0x0;
    EventQueueHead = (EventQueueType *)0x0;
    EventQueueAvailable = EventQueuePool;
    (*SDL20_memset)(&PendingKeydownEvent,0,0x18);
    (*SDL20_memset)(EventStates,1,0x20);
    EventStates[0xd] = '\0';
    (*SDL20_EventState)(0x201,0);
    iVar3 = (*SDL20_strcmp)(pcVar5,"x11");
    SupportSysWM = (SDL_bool)(iVar3 == 0);
    pcVar6 = (*SDL20_getenv)("SDL12COMPAT_ALLOW_SYSWM");
    if ((pcVar6 != (char *)0x0) &&
       (lVar9 = (*SDL20_strtol)(pcVar6,(char **)0x0,10), (int)lVar9 == 0)) {
      SupportSysWM = SDL_FALSE;
    }
    KeyRepeatEvent.type = '\0';
    KeyRepeatNextTicks = 0;
    KeyRepeatDelay = 0;
    KeyRepeatInterval = 0;
    (*SDL20_DelEventWatch)(EventFilter20to12,(void *)0x0);
    (*SDL20_AddEventWatch)(EventFilter20to12,(void *)0x0);
    pcVar6 = (*SDL20_getenv)("SDL_VIDEO_FULLSCREEN_DISPLAY");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (*SDL20_getenv)("SDL_VIDEO_FULLSCREEN_HEAD");
    }
    iVar3 = 0;
    if (pcVar6 != (char *)0x0) {
      iVar3 = 0;
      lVar9 = (*SDL20_strtol)(pcVar6,(char **)0x0,10);
      if ((-1 < (int)lVar9) && (iVar4 = (*SDL20_GetNumVideoDisplays)(), (int)lVar9 < iVar4)) {
        lVar9 = (*SDL20_strtol)(pcVar6,(char **)0x0,10);
        iVar3 = (int)lVar9;
      }
    }
    SwapInterval = 0;
    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    SVar14 = SDL_TRUE;
    VideoDisplayIndex = iVar3;
    (*SDL20_ShowCursor)(1);
    iVar3 = (*SDL20_GetNumDisplayModes)(VideoDisplayIndex);
    pcVar6 = (*SDL20_getenv)("SDL12COMPAT_MAX_BPP");
    if (pcVar6 == (char *)0x0) {
      lVar9 = 0x20;
    }
    else {
      lVar9 = (*SDL20_strtol)(pcVar6,(char **)0x0,10);
    }
    local_68.x = 0;
    local_68.y = 0;
    local_68.w = 0;
    local_68.h = 0;
    pcVar6 = (*SDL20_getenv)("SDL12COMPAT_OPENGL_SCALING");
    if (pcVar6 != (char *)0x0) {
      lVar13 = (*SDL20_strtol)(pcVar6,(char **)0x0,10);
      SVar14 = (SDL_bool)((int)lVar13 != 0);
    }
    iVar4 = 0;
    if (VideoModesCount < 1) {
      pcVar6 = (*SDL20_getenv)("SDL12COMPAT_PRESERVE_DEST_ALPHA");
      if (pcVar6 == (char *)0x0) {
        PreserveDestinationAlpha = SDL_TRUE;
      }
      else {
        lVar13 = (*SDL20_strtol)(pcVar6,(char **)0x0,10);
        PreserveDestinationAlpha = (SDL_bool)((int)lVar13 != 0);
      }
      WantOpenGLScaling = SVar14;
      pcVar6 = (*SDL20_getenv)("SDL12COMPAT_MAX_VIDMODE");
      maxw = 0;
      local_5c = SVar14;
      local_58 = pcVar5;
      if (pcVar6 != (char *)0x0) {
        local_80.format._0_1_ = 0;
        local_80.format._1_1_ = 0;
        local_80.format._2_2_ = 0;
        SDL_sscanf(pcVar6,"%ux%u",&local_80);
        if (0xffff < CONCAT22(local_80.format._2_2_,
                              CONCAT11(local_80.format._1_1_,(undefined1)local_80.format))) {
          local_80.format._0_1_ = 0xff;
          local_80.format._1_1_ = 0xff;
          local_80.format._2_2_ = 0;
        }
        maxw = CONCAT11(local_80.format._1_1_,(undefined1)local_80.format);
      }
      iVar15 = 0;
      local_48 = lVar8;
      if (iVar3 < 1) {
        local_50 = 0;
        uVar19 = 0;
        pVVar18 = (VideoModeList *)0x0;
      }
      else {
        local_40 = (ulong)((int)lVar9 << 0x1d | (int)lVar9 - 8U >> 3);
        pVVar18 = (VideoModeList *)0x0;
        uVar19 = 0;
        local_50 = 0;
        local_38 = lVar9;
        do {
          iVar4 = (*SDL20_GetDisplayMode)(VideoDisplayIndex,iVar15,&local_80);
          iVar12 = 6;
          if (-1 < iVar4) {
            if (((CONCAT22(local_80.h._2_2_,(ushort)local_80.h) == 0 &&
                  CONCAT22(local_80.w._2_2_,(ushort)local_80.w) == 0) && (IsDummyVideo != SDL_FALSE)
                ) && (LinkedSDL2VersionInt < 0x7e0)) {
              local_80.h._0_2_ = 0x300;
              local_80.h._2_2_ = 0;
              local_80.format._0_1_ = 4;
              local_80.format._1_1_ = 0x18;
              local_80.format._2_2_ = 0x1616;
              local_80.w._0_2_ = 0x400;
              local_80.w._2_2_ = 0;
            }
            if ((0 < CONCAT22(local_80.h._2_2_,(ushort)local_80.h) &&
                 0 < CONCAT22(local_80.w._2_2_,(ushort)local_80.w)) &&
               (CONCAT22(local_80.h._2_2_,(ushort)local_80.h) < 0x10000 &&
                CONCAT22(local_80.w._2_2_,(ushort)local_80.w) < 0x10000)) {
              if ((uint)local_38 < local_80.format._1_1_) {
                if ((uint)local_40 < 4) {
                  uVar21 = *(undefined4 *)(&DAT_00118120 + local_40 * 4);
                }
                else {
                  uVar21 = 0;
                  (*SDL20_SetError)("Unsupported bits-per-pixel");
                }
                local_80.format._0_1_ = (undefined1)uVar21;
                local_80.format._1_1_ = (byte)((uint)uVar21 >> 8);
                local_80.format._2_2_ = (undefined2)((uint)uVar21 >> 0x10);
              }
              if ((pVVar18 == (VideoModeList *)0x0) ||
                 (CONCAT22(local_80.format._2_2_,
                           CONCAT11(local_80.format._1_1_,(undefined1)local_80.format)) !=
                  pVVar18->format)) {
                pVVar10 = (VideoModeList *)
                          (*SDL20_realloc)(VideoModes,(long)VideoModesCount * 0x18 + 0x18);
                if (pVVar10 != (VideoModeList *)0x0) {
                  lVar8 = (long)VideoModesCount;
                  pVVar18 = pVVar10 + lVar8;
                  VideoModes = pVVar10;
                  pVVar10[lVar8].format =
                       CONCAT22(local_80.format._2_2_,
                                CONCAT11(local_80.format._1_1_,(undefined1)local_80.format));
                  VideoModesCount = VideoModesCount + 1;
                  *(undefined8 *)&pVVar10[lVar8].nummodes = 0;
                  *(undefined8 *)(&pVVar10[lVar8].nummodes + 2) = 0;
                  *(undefined4 *)((long)&pVVar10[lVar8].modes12 + 4) = 0;
                  goto LAB_00107aba;
                }
              }
              else {
LAB_00107aba:
                local_68.w = (ushort)local_80.w;
                local_68.h = (ushort)local_80.h;
                if (local_5c != SDL_FALSE) {
                  lVar8 = 0;
                  do {
                    uVar1 = *(ushort *)((long)&fake_modes[0].w + lVar8);
                    if ((uVar1 < uVar19) ||
                       ((uVar1 <= uVar19 &&
                        (*(ushort *)((long)&fake_modes[0].h + lVar8) < (ushort)local_50)))) {
                      if (((local_68.w < uVar1) ||
                          ((local_68.w <= uVar1 &&
                           (local_68.h < *(ushort *)((long)&fake_modes[0].h + lVar8))))) &&
                         (iVar4 = AddVidModeToList(pVVar18,(SDL12_Rect *)
                                                           ((long)&fake_modes[0].x + lVar8),maxw,0),
                         iVar4 != 0)) {
                        local_90 = (*SDL20_Error)(SDL_ENOMEM);
                        iVar12 = 1;
                        goto LAB_00107b8e;
                      }
                    }
                    lVar8 = lVar8 + 8;
                  } while (lVar8 != 0xe8);
                }
                iVar4 = AddVidModeToList(pVVar18,&local_68,maxw,0);
                if (iVar4 == 0) {
                  local_50 = (ulong)(ushort)local_80.h;
                  iVar12 = 0;
                  uVar19 = (ushort)local_80.w;
                  goto LAB_00107b8e;
                }
              }
              local_90 = (*SDL20_Error)(SDL_ENOMEM);
              iVar12 = 1;
            }
          }
LAB_00107b8e:
          if ((iVar12 != 6) && (pcVar5 = local_58, lVar8 = local_48, iVar4 = local_90, iVar12 != 0))
          goto LAB_00107cd0;
          iVar15 = iVar15 + 1;
        } while (iVar15 != iVar3);
      }
      if (local_5c != SDL_FALSE) {
        lVar8 = 0;
        do {
          uVar1 = *(ushort *)((long)&fake_modes[0].w + lVar8);
          if (((uVar1 < uVar19) ||
              ((uVar1 <= uVar19 && (*(ushort *)((long)&fake_modes[0].h + lVar8) < (ushort)local_50))
              )) && (iVar3 = AddVidModeToList(pVVar18,(SDL12_Rect *)((long)&fake_modes[0].x + lVar8)
                                              ,maxw,0), iVar3 != 0)) {
            iVar4 = (*SDL20_Error)(SDL_ENOMEM);
            pcVar5 = local_58;
            lVar8 = local_48;
            goto LAB_00107cd0;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0xe8);
      }
      lVar8 = local_48;
      if (0 < VideoModesCount) {
        iVar3 = 0;
        pVVar18 = VideoModes;
        iVar4 = local_90;
        do {
          iVar15 = pVVar18->nummodes;
          ppSVar11 = (SDL12_Rect **)(*SDL20_calloc)(8,(long)iVar15 + 1);
          pVVar18->modes12 = ppSVar11;
          if (ppSVar11 == (SDL12_Rect **)0x0) {
            iVar4 = (*SDL20_Error)(SDL_ENOMEM);
          }
          else if (0 < iVar15) {
            lVar9 = 0;
            do {
              *(long *)((long)pVVar18->modes12 + lVar9) = (long)&pVVar18->modeslist12->x + lVar9;
              lVar9 = lVar9 + 8;
            } while ((long)iVar15 * 8 != lVar9);
          }
          pcVar5 = local_58;
          if (ppSVar11 == (SDL12_Rect **)0x0) goto LAB_00107cd0;
          iVar3 = iVar3 + 1;
          pVVar18 = pVVar18 + 1;
        } while (iVar3 < VideoModesCount);
      }
      QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
      QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
      iVar4 = 0;
      pcVar5 = local_58;
    }
LAB_00107cd0:
    iVar3 = -1;
    if (-1 < iVar4) {
      (*SDL20_StopTextInput)();
      iVar4 = (*SDL20_GetDesktopDisplayMode)(VideoDisplayIndex,&local_80);
      p_Var2 = SDL20_AllocFormat;
      iVar3 = 0;
      if (iVar4 == 0) {
        UVar16 = CONCAT22(local_80.format._2_2_,
                          CONCAT11(local_80.format._1_1_,(undefined1)local_80.format));
        uVar20 = (uint)lVar8;
        if (uVar20 < local_80.format._1_1_) {
          uVar20 = uVar20 << 0x1d | uVar20 - 8 >> 3;
          if (uVar20 < 4) {
            UVar16 = *(Uint32 *)(&DAT_00118120 + (ulong)uVar20 * 4);
          }
          else {
            UVar16 = 0;
            (*SDL20_SetError)("Unsupported bits-per-pixel");
          }
        }
        VideoInfoVfmt20 = (*p_Var2)(UVar16);
        PixelFormat20to12(&VideoInfoVfmt12,&VideoInfoPalette12,VideoInfoVfmt20);
        VideoInfo12.vfmt = &VideoInfoVfmt12;
        VideoInfo12.current_w._2_2_ = local_80.w._2_2_;
        VideoInfo12.current_w._0_2_ = (ushort)local_80.w;
        VideoInfo12.current_h._0_2_ = (ushort)local_80.h;
        VideoInfo12.current_h._2_2_ = local_80.h._2_2_;
        lVar8 = 0;
        do {
          iVar3 = (*SDL20_strcasecmp)(pcVar5,(char *)((long)&HasWmAvailable_gui_targets_rel +
                                                     (long)*(int *)((long)&
                                                  HasWmAvailable_gui_targets_rel + lVar8)));
          if (iVar3 == 0) {
            uVar20 = 2;
            goto LAB_00107da7;
          }
          lVar8 = lVar8 + 4;
        } while (lVar8 == 4);
        uVar20 = 0;
LAB_00107da7:
        VideoInfo12._0_4_ = VideoInfo12._0_4_ & 0xfffffffd | uVar20;
        VideoInfo12.video_mem = 0x40000;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
Init12Video(void)
{
    const char *driver = SDL20_GetCurrentVideoDriver();
    const char *scale_method_env = SDL12Compat_GetHint("SDL12COMPAT_SCALE_METHOD");
    const unsigned max_bpp = SDL12Compat_GetHintInt("SDL12COMPAT_MAX_BPP", 32);
    SDL_DisplayMode mode;
    int i;

    AllowThreadedDraws = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_DRAWS", SDL_TRUE);
    AllowThreadedPumps = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_PUMPS", SDL_TRUE);

    WantScaleMethodNearest = (scale_method_env && !SDL20_strcmp(scale_method_env, "nearest")) ? SDL_TRUE : SDL_FALSE;

    /* Only override this if the env var is set, as the default is platform-specific. */
    TranslateKeyboardLayout = SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_KEYBOARD_LAYOUT", TranslateKeyboardLayout);

    IsDummyVideo = ((driver != NULL) && (SDL20_strcmp(driver, "dummy") == 0)) ? SDL_TRUE : SDL_FALSE;

    EventQueueMutex = SDL20_CreateMutex();
    if (EventQueueMutex == NULL) {
        return -1;
    }

    for (i = 0; i < SDL12_MAXEVENTS-1; i++) {
        EventQueuePool[i].next = &EventQueuePool[i+1];
    }
    EventQueuePool[SDL12_MAXEVENTS-1].next = NULL;

    EventQueueHead = EventQueueTail = NULL;
    EventQueueAvailable = EventQueuePool;

    SDL20_memset(&PendingKeydownEvent, 0, sizeof(SDL12_Event));

    SDL20_memset(EventStates, SDL_ENABLE, sizeof (EventStates)); /* on by default */

    EventStates[SDL12_SYSWMEVENT] = SDL_IGNORE;  /* off by default. */
    SDL20_EventState(SDL_SYSWMEVENT, SDL_IGNORE);

#if defined(SDL_VIDEO_DRIVER_WINDOWS)
    SupportSysWM = (SDL20_strcmp(driver, "windows") == 0) ? SDL_TRUE : SDL_FALSE;
#elif defined(SDL_VIDEO_DRIVER_X11)
    SupportSysWM = (SDL20_strcmp(driver, "x11") == 0) ? SDL_TRUE : SDL_FALSE;
#else
    SupportSysWM = SDL_FALSE;
#endif

    if (!SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_SYSWM", SDL_TRUE)) {
        SupportSysWM = SDL_FALSE;
    }

    SDL_EnableKeyRepeat(0, 0);

    SDL20_DelEventWatch(EventFilter20to12, NULL);
    SDL20_AddEventWatch(EventFilter20to12, NULL);

    VideoDisplayIndex = GetVideoDisplay();
    SwapInterval = 0;

    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    SDL20_ShowCursor(1);

    if (Init12VidModes() < 0) {
        return -1;
    }

    SDL20_StopTextInput();

    if (SDL20_GetDesktopDisplayMode(VideoDisplayIndex, &mode) == 0) {
        if (SDL_BITSPERPIXEL(mode.format) > max_bpp) {
            VideoInfoVfmt20 = SDL20_AllocFormat(BPPToPixelFormat(max_bpp));
        } else {
            VideoInfoVfmt20 = SDL20_AllocFormat(mode.format);
        }
        VideoInfo12.vfmt = PixelFormat20to12(&VideoInfoVfmt12, &VideoInfoPalette12, VideoInfoVfmt20);
        VideoInfo12.current_w = mode.w;
        VideoInfo12.current_h = mode.h;
        VideoInfo12.wm_available = HasWmAvailable(driver);
        VideoInfo12.video_mem = 1024 * 256;  /* good enough. */
    }

    return 0;
}